

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaParser::ReadInputChannel
          (ColladaParser *this,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *poChannels)

{
  _Base_ptr p_Var1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  ColladaParser *this_00;
  char *__s;
  char *source;
  string semantic;
  InputChannel channel;
  string local_230;
  char *local_210;
  undefined1 local_208 [40];
  ulong local_1e0;
  long lStack_1d8;
  _Alloc_hider local_1d0;
  _Base_ptr local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [384];
  
  local_1c8 = (_Base_ptr)0x0;
  local_1c0._M_local_buf[0] = '\0';
  local_208._32_4_ = 0;
  local_1b0._0_8_ = 0;
  local_1e0 = 0;
  lStack_1d8 = 0;
  local_1d0._M_p = (pointer)&local_1c0;
  uVar2 = GetAttribute(this,"semantic");
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
  this_00 = (ColladaParser *)local_208;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this_00,(char *)CONCAT44(extraout_var,iVar3),
             (allocator<char> *)(local_1b0 + 8));
  local_208._32_4_ = GetTypeForSemantic(this_00,(string *)local_208);
  GetAttribute(this,"source");
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
  p_Var1 = local_1c8;
  local_210 = (char *)CONCAT44(extraout_var_00,iVar3);
  if (*local_210 != '#') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Unknown reference format in url \"",0x21);
    poVar4 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        (local_1b0 + 8),&local_210);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\" in source attribute of <input> element.",0x29);
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_230);
  }
  __s = local_210 + 1;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_1d0,0,(char *)p_Var1,(ulong)__s);
  uVar2 = TestAttribute(this,"offset");
  if (-1 < (int)uVar2) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar2);
    lStack_1d8 = (long)iVar3;
  }
  if (((local_208._32_4_ & ~IT_Vertex) == IT_Texcoord) &&
     (uVar2 = TestAttribute(this,"set"), -1 < (int)uVar2)) {
    uVar2 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar2);
    if ((int)uVar2 < 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Invalid index \"",0xf);
      std::ostream::operator<<(local_1b0 + 8,uVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"\" in set attribute of <input> element",0x25);
      std::__cxx11::stringbuf::str();
      ThrowException(this,&local_230);
    }
    local_1e0 = (ulong)uVar2;
  }
  if (local_208._32_4_ != IT_Invalid) {
    std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
    push_back(poChannels,(value_type *)(local_208 + 0x20));
  }
  SkipElement(this);
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_p != &local_1c0) {
    operator_delete(local_1d0._M_p,
                    CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ColladaParser::ReadInputChannel(std::vector<InputChannel>& poChannels)
{
    InputChannel channel;

    // read semantic
    int attrSemantic = GetAttribute("semantic");
    std::string semantic = mReader->getAttributeValue(attrSemantic);
    channel.mType = GetTypeForSemantic(semantic);

    // read source
    int attrSource = GetAttribute("source");
    const char* source = mReader->getAttributeValue(attrSource);
    if (source[0] != '#')
        ThrowException(format() << "Unknown reference format in url \"" << source << "\" in source attribute of <input> element.");
    channel.mAccessor = source + 1; // skipping the leading #, hopefully the remaining text is the accessor ID only

    // read index offset, if per-index <input>
    int attrOffset = TestAttribute("offset");
    if (attrOffset > -1)
        channel.mOffset = mReader->getAttributeValueAsInt(attrOffset);

    // read set if texture coordinates
    if (channel.mType == IT_Texcoord || channel.mType == IT_Color) {
        int attrSet = TestAttribute("set");
        if (attrSet > -1) {
            attrSet = mReader->getAttributeValueAsInt(attrSet);
            if (attrSet < 0)
                ThrowException(format() << "Invalid index \"" << (attrSet) << "\" in set attribute of <input> element");

            channel.mIndex = attrSet;
        }
    }

    // store, if valid type
    if (channel.mType != IT_Invalid)
        poChannels.push_back(channel);

    // skip remaining stuff of this element, if any
    SkipElement();
}